

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_quick_sort_recursive(int64_t *dst,size_t original_left,size_t original_right)

{
  long lVar1;
  int iVar2;
  size_t b;
  int64_t *in_RDX;
  int64_t *in_RSI;
  int64_t *in_RDI;
  int max_loops;
  int loop_count;
  size_t middle;
  size_t new_pivot;
  size_t pivot;
  size_t right;
  size_t left;
  int iVar3;
  int64_t *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  int64_t *in_stack_ffffffffffffffd0;
  int64_t *local_28;
  int64_t *dst_00;
  
  iVar3 = 0;
  lVar1 = 0x3f;
  if ((long)in_RDX - (long)in_RSI != 0) {
    for (; (ulong)((long)in_RDX - (long)in_RSI) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar2 = 0x40 - ((uint)lVar1 ^ 0x3f);
  local_28 = in_RDX;
  dst_00 = in_RSI;
  while( true ) {
    if (local_28 <= in_RSI) {
      return;
    }
    if ((ulong)((long)local_28 + (1 - (long)in_RSI)) < 0x11) {
      sorter_bitonic_sort(in_stack_ffffffffffffffc0,CONCAT44(iVar3,iVar2));
      return;
    }
    iVar3 = iVar3 + 1;
    if (iVar2 <= iVar3) {
      sorter_heap_sort(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      return;
    }
    in_stack_ffffffffffffffc0 =
         (int64_t *)((long)in_RSI + ((ulong)((long)local_28 - (long)in_RSI) >> 1));
    b = sorter_median(in_RDI,(size_t)in_RSI,(size_t)in_stack_ffffffffffffffc0,(size_t)local_28);
    in_stack_ffffffffffffffd0 =
         (int64_t *)
         sorter_median(in_RDI,(long)in_RSI +
                              ((ulong)((long)in_stack_ffffffffffffffc0 - (long)in_RSI) >> 1),b,
                       (long)in_stack_ffffffffffffffc0 +
                       ((ulong)((long)local_28 - (long)in_stack_ffffffffffffffc0) >> 1));
    in_stack_ffffffffffffffc8 =
         sorter_quick_sort_partition
                   (in_RDI,(size_t)in_RSI,(size_t)local_28,(size_t)in_stack_ffffffffffffffd0);
    if (in_stack_ffffffffffffffc8 == 0xffffffffffffffff) break;
    if ((long)local_28 + (-1 - in_stack_ffffffffffffffc8) <
        (in_stack_ffffffffffffffc8 - 1) - (long)in_RSI) {
      sorter_quick_sort_recursive(dst_00,(size_t)in_RDX,(size_t)in_RSI);
      local_28 = (int64_t *)(in_stack_ffffffffffffffc8 - 1);
    }
    else {
      sorter_quick_sort_recursive(dst_00,(size_t)in_RDX,(size_t)in_RSI);
      in_RSI = (int64_t *)(in_stack_ffffffffffffffc8 + 1);
    }
  }
  return;
}

Assistant:

static void QUICK_SORT_RECURSIVE(SORT_TYPE *dst, const size_t original_left,
                                 const size_t original_right) {
  size_t left;
  size_t right;
  size_t pivot;
  size_t new_pivot;
  size_t middle;
  int loop_count = 0;
  const int max_loops = 64 - CLZ(original_right - original_left); /* ~lg N */
  left = original_left;
  right = original_right;

  while (1) {
    if (right <= left) {
      return;
    }

    if ((right - left + 1U) <= SMALL_SORT_BND) {
      SMALL_SORT(&dst[left], right - left + 1U);
      return;
    }

    if (++loop_count >= max_loops) {
      /* we have recursed / looped too many times; switch to heap sort */
      HEAP_SORT(&dst[left], right - left + 1U);
      return;
    }

    /* median of 5 */
    middle = left + ((right - left) >> 1);
    pivot = MEDIAN((const SORT_TYPE *)dst, left, middle, right);
    pivot = MEDIAN((const SORT_TYPE *)dst, left + ((middle - left) >> 1), pivot,
                   middle + ((right - middle) >> 1));
    new_pivot = QUICK_SORT_PARTITION(dst, left, right, pivot);

    /* check for partition all equal */
    if (new_pivot == SIZE_MAX) {
      return;
    }

    /* recurse only on the small part to avoid degenerate stack sizes */
    /* and manually do tail call on the large part */
    if (new_pivot - 1U - left > right - new_pivot - 1U) {
      /* left is bigger than right */
      QUICK_SORT_RECURSIVE(dst, new_pivot + 1U, right);
      /* tail call for left */
      right = new_pivot - 1U;
    } else {
      /* right is bigger than left */
      QUICK_SORT_RECURSIVE(dst, left, new_pivot - 1U);
      /* tail call for right */
      left = new_pivot + 1U;
    }
  }
}